

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

Symbol __thiscall
google::protobuf::DescriptorPool::NewPlaceholderWithMutexHeld
          (DescriptorPool *this,StringPiece name,PlaceholderType placeholder_type)

{
  byte bVar1;
  Tables *pTVar2;
  char cVar3;
  size_type sVar4;
  string *psVar5;
  FileDescriptor *pFVar6;
  SymbolBase *__s;
  string *psVar7;
  undefined8 *puVar8;
  AlphaNum *pAVar9;
  AlphaNum *b;
  StringPiece SVar10;
  StringPiece local_e8;
  StringPiece name_local;
  StringPiece local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_80;
  AlphaNum local_60;
  
  name_local.length_ = name.length_;
  name_local.ptr_ = name.ptr_;
  local_c8 = (StringPiece)ZEXT816(0);
  sVar4 = 0;
  b = (AlphaNum *)0x0;
  do {
    if (name_local.length_ == sVar4) {
      __s = (anonymous_namespace)::kNullSymbol;
      if (name_local.length_ != 0 && b == (AlphaNum *)0x0) {
        cVar3 = stringpiece_internal::StringPiece::operator[](&name_local,0);
        if (cVar3 == '.') {
          local_e8 = stringpiece_internal::StringPiece::substr(&name_local,1,0xffffffffffffffff);
        }
        else {
          local_e8.length_ = name_local.length_;
          local_e8.ptr_ = name_local.ptr_;
        }
        sVar4 = stringpiece_internal::StringPiece::rfind(&local_e8,'.',0xffffffffffffffff);
        if (sVar4 == 0xffffffffffffffff) {
          internal::InitProtobufDefaults();
          local_c8 = local_e8;
          psVar5 = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
        }
        else {
          pTVar2 = (this->tables_)._M_t.
                   super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                   .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                   _M_head_impl;
          SVar10 = stringpiece_internal::StringPiece::substr(&local_e8,0,sVar4);
          psVar5 = Tables::AllocateString_abi_cxx11_(pTVar2,SVar10);
          local_c8 = stringpiece_internal::StringPiece::substr
                               (&local_e8,sVar4 + 1,0xffffffffffffffff);
        }
        local_b0._M_dataplus._M_p = local_e8.ptr_;
        local_b0._M_string_length = local_e8.length_;
        local_60.piece_data_ = ".placeholder.proto";
        local_60.piece_size_ = 0x12;
        StrCat_abi_cxx11_(&local_80,(protobuf *)&local_b0,&local_60,b);
        sVar4 = stringpiece_internal::StringPiece::CheckSize(local_80._M_string_length);
        SVar10.length_ = sVar4;
        SVar10.ptr_ = local_80._M_dataplus._M_p;
        pFVar6 = NewPlaceholderFileWithMutexHeld(this,SVar10);
        std::__cxx11::string::~string((string *)&local_80);
        *(string **)(pFVar6 + 8) = psVar5;
        if (placeholder_type == PLACEHOLDER_ENUM) {
          *(undefined4 *)(pFVar6 + 0x30) = 1;
          __s = (SymbolBase *)
                Tables::AllocateBytes
                          ((this->tables_)._M_t.
                           super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                           .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>
                           ._M_head_impl,0x48);
          *(SymbolBase **)(pFVar6 + 0x60) = __s;
          *(undefined8 *)__s = 0;
          *(undefined8 *)(__s + 8) = 0;
          *(undefined8 *)(__s + 0x10) = 0;
          *(undefined8 *)(__s + 0x18) = 0;
          *(undefined8 *)(__s + 0x20) = 0;
          *(undefined8 *)(__s + 0x28) = 0;
          *(undefined8 *)(__s + 0x30) = 0;
          *(undefined8 *)(__s + 0x38) = 0;
          *(undefined8 *)(__s + 0x40) = 0;
          psVar7 = Tables::
                   AllocateStringArray<google::protobuf::stringpiece_internal::StringPiece&,google::protobuf::stringpiece_internal::StringPiece&>
                             ((this->tables_)._M_t.
                              super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                              .
                              super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>
                              ._M_head_impl,&local_c8,&local_e8);
          *(string **)(__s + 8) = psVar7;
          *(FileDescriptor **)(__s + 0x10) = pFVar6;
          *(undefined1 **)(__s + 0x20) = _EnumOptions_default_instance_;
          __s[1].symbol_type_ = __s[1].symbol_type_ | 1;
          cVar3 = stringpiece_internal::StringPiece::operator[](&name_local,0);
          __s[1].symbol_type_ = __s[1].symbol_type_ & 0xfd | (cVar3 != '.') * '\x02';
          *(undefined4 *)(__s + 4) = 1;
          puVar8 = (undefined8 *)
                   Tables::AllocateBytes
                             ((this->tables_)._M_t.
                              super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                              .
                              super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>
                              ._M_head_impl,0x20);
          *(undefined8 **)(__s + 0x28) = puVar8;
          *(undefined2 *)(__s + 2) = 0xffff;
          puVar8[2] = 0;
          puVar8[3] = 0;
          *puVar8 = 0;
          puVar8[1] = 0;
          pTVar2 = (this->tables_)._M_t.
                   super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                   .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                   _M_head_impl;
          if (psVar5->_M_string_length == 0) {
            std::__cxx11::string::string
                      ((string *)&local_b0,"PLACEHOLDER_VALUE",(allocator *)&local_60);
          }
          else {
            std::operator+(&local_b0,psVar5,".PLACEHOLDER_VALUE");
          }
          psVar5 = Tables::AllocateStringArray<char_const(&)[18],std::__cxx11::string>
                             (pTVar2,(char (*) [18])0x428e6e,&local_b0);
          puVar8[1] = psVar5;
          std::__cxx11::string::~string((string *)&local_b0);
          *(undefined4 *)((long)puVar8 + 4) = 0;
          puVar8[2] = __s;
          puVar8[3] = _EnumValueOptions_default_instance_;
          __s->symbol_type_ = '\x04';
        }
        else {
          *(undefined4 *)(pFVar6 + 0x2c) = 1;
          __s = (SymbolBase *)
                Tables::AllocateBytes
                          ((this->tables_)._M_t.
                           super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                           .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>
                           ._M_head_impl,0x88);
          *(SymbolBase **)(pFVar6 + 0x58) = __s;
          memset(__s,0,0x88);
          psVar5 = Tables::
                   AllocateStringArray<google::protobuf::stringpiece_internal::StringPiece&,google::protobuf::stringpiece_internal::StringPiece&>
                             ((this->tables_)._M_t.
                              super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                              .
                              super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>
                              ._M_head_impl,&local_c8,&local_e8);
          *(string **)(__s + 8) = psVar5;
          *(FileDescriptor **)(__s + 0x10) = pFVar6;
          *(undefined1 **)(__s + 0x20) = _MessageOptions_default_instance_;
          __s[1].symbol_type_ = __s[1].symbol_type_ | 1;
          cVar3 = stringpiece_internal::StringPiece::operator[](&name_local,0);
          __s[1].symbol_type_ = __s[1].symbol_type_ & 0xfd | (cVar3 != '.') * '\x02';
          if (placeholder_type == PLACEHOLDER_EXTENDABLE_MESSAGE) {
            *(undefined4 *)(__s + 0x78) = 1;
            puVar8 = (undefined8 *)
                     Tables::AllocateBytes
                               ((this->tables_)._M_t.
                                super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                                .
                                super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>
                                ._M_head_impl,0x10);
            *(undefined8 **)(__s + 0x48) = puVar8;
            *puVar8 = 0x2000000000000001;
            puVar8[1] = 0;
          }
          __s->symbol_type_ = '\x01';
        }
      }
      return (Symbol)__s;
    }
    bVar1 = name_local.ptr_[sVar4];
    if (((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a) || (bVar1 == 0x5f || (byte)(bVar1 - 0x30) < 10)) {
      pAVar9 = (AlphaNum *)0x0;
    }
    else {
      pAVar9 = b;
      if (b == (AlphaNum *)0x0) {
        pAVar9 = (AlphaNum *)0x1;
      }
      if (bVar1 != 0x2e) {
        return (Symbol)(anonymous_namespace)::kNullSymbol;
      }
      if (b != (AlphaNum *)0x0) {
        return (Symbol)(anonymous_namespace)::kNullSymbol;
      }
    }
    sVar4 = sVar4 + 1;
    b = pAVar9;
  } while( true );
}

Assistant:

Symbol DescriptorPool::NewPlaceholderWithMutexHeld(
    StringPiece name, PlaceholderType placeholder_type) const {
  if (mutex_) {
    mutex_->AssertHeld();
  }
  // Compute names.
  StringPiece placeholder_full_name;
  StringPiece placeholder_name;
  const std::string* placeholder_package;

  if (!ValidateQualifiedName(name)) return kNullSymbol;
  if (name[0] == '.') {
    // Fully-qualified.
    placeholder_full_name = name.substr(1);
  } else {
    placeholder_full_name = name;
  }

  std::string::size_type dotpos = placeholder_full_name.find_last_of('.');
  if (dotpos != std::string::npos) {
    placeholder_package =
        tables_->AllocateString(placeholder_full_name.substr(0, dotpos));
    placeholder_name = placeholder_full_name.substr(dotpos + 1);
  } else {
    placeholder_package = &internal::GetEmptyString();
    placeholder_name = placeholder_full_name;
  }

  // Create the placeholders.
  FileDescriptor* placeholder_file = NewPlaceholderFileWithMutexHeld(
      StrCat(placeholder_full_name, ".placeholder.proto"));
  placeholder_file->package_ = placeholder_package;

  if (placeholder_type == PLACEHOLDER_ENUM) {
    placeholder_file->enum_type_count_ = 1;
    placeholder_file->enum_types_ = tables_->AllocateArray<EnumDescriptor>(1);

    EnumDescriptor* placeholder_enum = &placeholder_file->enum_types_[0];
    memset(static_cast<void*>(placeholder_enum), 0, sizeof(*placeholder_enum));

    placeholder_enum->all_names_ =
        tables_->AllocateStringArray(placeholder_name, placeholder_full_name);
    placeholder_enum->file_ = placeholder_file;
    placeholder_enum->options_ = &EnumOptions::default_instance();
    placeholder_enum->is_placeholder_ = true;
    placeholder_enum->is_unqualified_placeholder_ = (name[0] != '.');

    // Enums must have at least one value.
    placeholder_enum->value_count_ = 1;
    placeholder_enum->values_ = tables_->AllocateArray<EnumValueDescriptor>(1);
    // Disable fast-path lookup for this enum.
    placeholder_enum->sequential_value_limit_ = -1;

    EnumValueDescriptor* placeholder_value = &placeholder_enum->values_[0];
    memset(static_cast<void*>(placeholder_value), 0,
           sizeof(*placeholder_value));

    // Note that enum value names are siblings of their type, not children.
    placeholder_value->all_names_ = tables_->AllocateStringArray(
        "PLACEHOLDER_VALUE", placeholder_package->empty()
                                 ? "PLACEHOLDER_VALUE"
                                 : *placeholder_package + ".PLACEHOLDER_VALUE");

    placeholder_value->number_ = 0;
    placeholder_value->type_ = placeholder_enum;
    placeholder_value->options_ = &EnumValueOptions::default_instance();

    return Symbol(placeholder_enum);
  } else {
    placeholder_file->message_type_count_ = 1;
    placeholder_file->message_types_ = tables_->AllocateArray<Descriptor>(1);

    Descriptor* placeholder_message = &placeholder_file->message_types_[0];
    memset(static_cast<void*>(placeholder_message), 0,
           sizeof(*placeholder_message));

    placeholder_message->all_names_ =
        tables_->AllocateStringArray(placeholder_name, placeholder_full_name);
    placeholder_message->file_ = placeholder_file;
    placeholder_message->options_ = &MessageOptions::default_instance();
    placeholder_message->is_placeholder_ = true;
    placeholder_message->is_unqualified_placeholder_ = (name[0] != '.');

    if (placeholder_type == PLACEHOLDER_EXTENDABLE_MESSAGE) {
      placeholder_message->extension_range_count_ = 1;
      placeholder_message->extension_ranges_ =
          tables_->AllocateArray<Descriptor::ExtensionRange>(1);
      placeholder_message->extension_ranges_->start = 1;
      // kMaxNumber + 1 because ExtensionRange::end is exclusive.
      placeholder_message->extension_ranges_->end =
          FieldDescriptor::kMaxNumber + 1;
      placeholder_message->extension_ranges_->options_ = nullptr;
    }

    return Symbol(placeholder_message);
  }
}